

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall asl::File::hasExtension(File *this,String *extensions)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Array<asl::String> exts;
  String ext;
  undefined1 local_58 [32];
  String local_38;
  
  String::toLowerCase(&local_38,extensions);
  local_58._8_8_ = (char *)0x100000000;
  local_58._16_2_ = 0x7c;
  String::split((String *)local_58,&local_38);
  if (local_58._8_4_ != 0) {
    free((void *)CONCAT62(local_58._18_6_,local_58._16_2_));
  }
  if (local_38._size != 0) {
    free(local_38.field_2._str);
  }
  extension((String *)(local_58 + 8),this);
  String::toLowerCase(&local_38,(String *)(local_58 + 8));
  if (local_58._8_4_ != 0) {
    free((void *)CONCAT62(local_58._18_6_,local_58._16_2_));
  }
  if (*(int *)&((String *)(local_58._0_8_ + -0x18))->field_2 < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    lVar2 = 0;
    do {
      bVar1 = String::operator==(&local_38,(String *)((long)(int *)local_58._0_8_ + lVar3));
      if (bVar1) break;
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < *(int *)&((String *)(local_58._0_8_ + -0x18))->field_2);
  }
  if (local_38._size != 0) {
    free(local_38.field_2._str);
  }
  Array<asl::String>::~Array((Array<asl::String> *)local_58);
  return bVar1;
}

Assistant:

bool File::hasExtension(const String& extensions) const
{
	Array<String> exts = extensions.toLowerCase().split('|');
	String ext = extension().toLowerCase();
	for (int i = 0; i < exts.length(); i++)
		if (ext == exts[i])
			return true;
	return false;
}